

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O3

bool __thiscall
cmFileCopier::Parse(cmFileCopier *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  char *__s;
  cmExecutionStatus *pcVar1;
  ulong uVar2;
  int iVar3;
  size_t sVar4;
  ostream *poVar5;
  bool bVar6;
  ulong uVar7;
  pointer pbVar8;
  ulong uVar9;
  ostringstream e;
  undefined1 auStack_1c8 [8];
  long *local_1c0;
  long local_1b0 [2];
  undefined1 local_1a0 [376];
  
  this->Doing = 4;
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8)) {
    uVar2 = 2;
    uVar9 = 1;
    do {
      uVar7 = uVar2;
      iVar3 = (*this->_vptr_cmFileCopier[8])(this,pbVar8 + uVar9);
      if ((char)iVar3 == '\0') {
        iVar3 = (*this->_vptr_cmFileCopier[9])
                          (this,(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar9);
        if ((char)iVar3 == '\0') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a0,"called with unknown argument \"",0x1e);
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a0,pbVar8[uVar9]._M_dataplus._M_p,
                              pbVar8[uVar9]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
          pcVar1 = this->Status;
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
          goto LAB_00489167;
        }
      }
      if (this->Doing == 1) goto LAB_004891a0;
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar2 = (ulong)((int)uVar7 + 1);
      uVar9 = uVar7;
    } while (uVar7 < (ulong)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5))
    ;
  }
  if ((this->Destination)._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    __s = this->Name;
    if (__s == (char *)0x0) {
      std::ios::clear((int)(auStack_1c8 + (long)*(_func_int **)(local_1a0._0_8_ + -0x18)) + 0x28);
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,__s,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0," given no DESTINATION",0x15);
    pcVar1 = this->Status;
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
LAB_00489167:
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0,local_1b0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
LAB_004891a0:
    bVar6 = false;
  }
  else {
    if ((this->UseGivenPermissionsFile == false) && (this->UseSourcePermissions == false)) {
      (*this->_vptr_cmFileCopier[10])(this);
    }
    bVar6 = true;
    if ((this->UseGivenPermissionsDir == false) && (this->UseSourcePermissions == false)) {
      (*this->_vptr_cmFileCopier[0xb])(this);
    }
  }
  return bVar6;
}

Assistant:

bool cmFileCopier::Parse(std::vector<std::string> const& args)
{
  this->Doing = DoingFiles;
  for (unsigned int i = 1; i < args.size(); ++i) {
    // Check this argument.
    if (!this->CheckKeyword(args[i]) && !this->CheckValue(args[i])) {
      std::ostringstream e;
      e << "called with unknown argument \"" << args[i] << "\".";
      this->Status.SetError(e.str());
      return false;
    }

    // Quit if an argument is invalid.
    if (this->Doing == DoingError) {
      return false;
    }
  }

  // Require a destination.
  if (this->Destination.empty()) {
    std::ostringstream e;
    e << this->Name << " given no DESTINATION";
    this->Status.SetError(e.str());
    return false;
  }

  // If file permissions were not specified set default permissions.
  if (!this->UseGivenPermissionsFile && !this->UseSourcePermissions) {
    this->DefaultFilePermissions();
  }

  // If directory permissions were not specified set default permissions.
  if (!this->UseGivenPermissionsDir && !this->UseSourcePermissions) {
    this->DefaultDirectoryPermissions();
  }

  return true;
}